

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O0

int hostline(LIBSSH2_KNOWNHOSTS *hosts,char *host,size_t hostlen,char *key,size_t keylen)

{
  int iVar1;
  bool bVar2;
  int local_64;
  size_t sStack_60;
  int key_type;
  size_t key_type_len;
  size_t commentlen;
  char *key_type_name;
  char *comment;
  size_t keylen_local;
  char *key_local;
  size_t hostlen_local;
  char *host_local;
  LIBSSH2_KNOWNHOSTS *hosts_local;
  
  key_type_name = (char *)0x0;
  commentlen = 0;
  key_type_len = 0;
  sStack_60 = 0;
  if (keylen < 0x14) {
    hosts_local._4_4_ =
         _libssh2_error(hosts->session,-0x21,"Failed to parse known_hosts line (key too short)");
  }
  else {
    comment = (char *)keylen;
    keylen_local = (size_t)key;
    if ((int)*key - 0x30U < 10) {
      local_64 = 0x40000;
    }
    else {
      while( true ) {
        bVar2 = false;
        if (((comment != (char *)0x0) && (bVar2 = false, *(char *)keylen_local != '\0')) &&
           (bVar2 = false, *(char *)keylen_local != ' ')) {
          bVar2 = *(char *)keylen_local != '\t';
        }
        if (!bVar2) break;
        keylen_local = keylen_local + 1;
        comment = comment + -1;
      }
      sStack_60 = keylen_local - (long)key;
      iVar1 = strncmp(key,"ssh-dss",sStack_60);
      if (iVar1 == 0) {
        local_64 = 0xc0000;
      }
      else {
        iVar1 = strncmp(key,"ssh-rsa",sStack_60);
        if (iVar1 == 0) {
          local_64 = 0x80000;
        }
        else {
          iVar1 = strncmp(key,"ecdsa-sha2-nistp256",sStack_60);
          if (iVar1 == 0) {
            local_64 = 0x100000;
          }
          else {
            iVar1 = strncmp(key,"ecdsa-sha2-nistp384",sStack_60);
            if (iVar1 == 0) {
              local_64 = 0x140000;
            }
            else {
              iVar1 = strncmp(key,"ecdsa-sha2-nistp521",sStack_60);
              if (iVar1 == 0) {
                local_64 = 0x180000;
              }
              else {
                iVar1 = strncmp(key,"ssh-ed25519",sStack_60);
                if (iVar1 == 0) {
                  local_64 = 0x1c0000;
                }
                else {
                  local_64 = 0x3c0000;
                }
              }
            }
          }
        }
      }
      while( true ) {
        bVar2 = true;
        if (*(char *)keylen_local != ' ') {
          bVar2 = *(char *)keylen_local == '\t';
        }
        if (!bVar2) break;
        keylen_local = keylen_local + 1;
        comment = comment + -1;
      }
      key_type_name = (char *)keylen_local;
      key_type_len = (size_t)comment;
      while( true ) {
        bVar2 = false;
        if (((key_type_len != 0) && (bVar2 = false, *key_type_name != '\0')) &&
           (bVar2 = false, *key_type_name != ' ')) {
          bVar2 = *key_type_name != '\t';
        }
        if (!bVar2) break;
        key_type_name = key_type_name + 1;
        key_type_len = key_type_len - 1;
      }
      comment = comment + -key_type_len;
      if (key_type_len == 0) {
        key_type_name = (char *)0x0;
      }
      while( true ) {
        bVar2 = false;
        if (((key_type_len != 0) && (bVar2 = false, *key_type_name != '\0')) &&
           (bVar2 = true, *key_type_name != ' ')) {
          bVar2 = *key_type_name == '\t';
        }
        commentlen = (size_t)key;
        if (!bVar2) break;
        key_type_name = key_type_name + 1;
        key_type_len = key_type_len - 1;
      }
    }
    if ((hostlen < 3) || (iVar1 = memcmp(host,"|1|",3), iVar1 == 0)) {
      hosts_local._4_4_ =
           hashed_hostline(hosts,host,hostlen,(char *)commentlen,sStack_60,(char *)keylen_local,
                           (size_t)comment,local_64,key_type_name,key_type_len);
    }
    else {
      hosts_local._4_4_ =
           oldstyle_hostline(hosts,host,hostlen,(char *)commentlen,sStack_60,(char *)keylen_local,
                             (size_t)comment,local_64,key_type_name,key_type_len);
    }
  }
  return hosts_local._4_4_;
}

Assistant:

static int hostline(LIBSSH2_KNOWNHOSTS *hosts,
                    const char *host, size_t hostlen,
                    const char *key, size_t keylen)
{
    const char *comment = NULL;
    const char *key_type_name = NULL;
    size_t commentlen = 0;
    size_t key_type_len = 0;
    int key_type;

    /* make some checks that the lengths seem sensible */
    if(keylen < 20)
        return _libssh2_error(hosts->session,
                              LIBSSH2_ERROR_METHOD_NOT_SUPPORTED,
                              "Failed to parse known_hosts line "
                              "(key too short)");

    switch(key[0]) {
    case '0': case '1': case '2': case '3': case '4':
    case '5': case '6': case '7': case '8': case '9':
        key_type = LIBSSH2_KNOWNHOST_KEY_RSA1;

        /* Note that the old-style keys (RSA1) aren't truly base64, but we
         * claim it is for now since we can get away with strcmp()ing the
         * entire anything anyway! We need to check and fix these to make them
         * work properly.
         */
        break;

    default:
        key_type_name = key;
        while(keylen && *key &&
               (*key != ' ') && (*key != '\t')) {
            key++;
            keylen--;
        }
        key_type_len = key - key_type_name;

        if(!strncmp(key_type_name, "ssh-dss", key_type_len))
            key_type = LIBSSH2_KNOWNHOST_KEY_SSHDSS;
        else if(!strncmp(key_type_name, "ssh-rsa", key_type_len))
            key_type = LIBSSH2_KNOWNHOST_KEY_SSHRSA;
        else if(!strncmp(key_type_name, "ecdsa-sha2-nistp256", key_type_len))
            key_type = LIBSSH2_KNOWNHOST_KEY_ECDSA_256;
        else if(!strncmp(key_type_name, "ecdsa-sha2-nistp384", key_type_len))
            key_type = LIBSSH2_KNOWNHOST_KEY_ECDSA_384;
        else if(!strncmp(key_type_name, "ecdsa-sha2-nistp521", key_type_len))
            key_type = LIBSSH2_KNOWNHOST_KEY_ECDSA_521;
        else if(!strncmp(key_type_name, "ssh-ed25519", key_type_len))
            key_type = LIBSSH2_KNOWNHOST_KEY_ED25519;
        else
            key_type = LIBSSH2_KNOWNHOST_KEY_UNKNOWN;

        /* skip whitespaces */
        while((*key ==' ') || (*key == '\t')) {
            key++;
            keylen--;
        }

        comment = key;
        commentlen = keylen;

        /* move over key */
        while(commentlen && *comment &&
              (*comment != ' ') && (*comment != '\t')) {
            comment++;
            commentlen--;
        }

        /* reduce key by comment length */
        keylen -= commentlen;

        /* Distinguish empty comment (a space) from no comment (no space) */
        if(commentlen == 0)
            comment = NULL;

        /* skip whitespaces */
        while(commentlen && *comment &&
              ((*comment ==' ') || (*comment == '\t'))) {
            comment++;
            commentlen--;
        }
        break;
    }

    /* Figure out host format */
    if((hostlen > 2) && memcmp(host, "|1|", 3)) {
        /* old style plain text: [name]([,][name])*

           for the sake of simplicity, we add them as separate hosts with the
           same key
        */
        return oldstyle_hostline(hosts, host, hostlen, key_type_name,
                                 key_type_len, key, keylen, key_type,
                                 comment, commentlen);
    }
    else {
        /* |1|[salt]|[hash] */
        return hashed_hostline(hosts, host, hostlen, key_type_name,
                               key_type_len, key, keylen, key_type,
                               comment, commentlen);
    }
}